

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O1

OPJ_SIZE_T
opj_stream_write_data
          (opj_stream_private_t *p_stream,OPJ_BYTE *p_buffer,OPJ_SIZE_T p_size,
          opj_event_mgr_t *p_event_mgr)

{
  int iVar1;
  opj_bool oVar2;
  ulong uVar3;
  uint uVar4;
  
  if ((p_stream->m_status & 8) == 0) {
    iVar1 = 0;
    do {
      uVar4 = p_stream->m_buffer_size - p_stream->m_bytes_in_buffer;
      if (p_size < uVar4 || p_size - uVar4 == 0) {
        uVar3 = (ulong)p_size;
        memcpy(p_stream->m_current_data,p_buffer,uVar3);
        p_stream->m_current_data = p_stream->m_current_data + uVar3;
        p_stream->m_bytes_in_buffer = p_stream->m_bytes_in_buffer + p_size;
        p_stream->m_byte_offset = p_stream->m_byte_offset + uVar3;
        return iVar1 + p_size;
      }
      if (p_stream->m_buffer_size != p_stream->m_bytes_in_buffer) {
        iVar1 = iVar1 + uVar4;
        uVar3 = (ulong)uVar4;
        memcpy(p_stream->m_current_data,p_buffer,uVar3);
        p_stream->m_current_data = p_stream->m_stored_data;
        p_buffer = p_buffer + uVar3;
        p_stream->m_bytes_in_buffer = p_stream->m_bytes_in_buffer + uVar4;
        p_stream->m_byte_offset = p_stream->m_byte_offset + uVar3;
        p_size = p_size - uVar4;
      }
      oVar2 = opj_stream_flush(p_stream,p_event_mgr);
    } while (oVar2 != 0);
  }
  return 0xffffffff;
}

Assistant:

OPJ_SIZE_T opj_stream_write_data (opj_stream_private_t * p_stream,const OPJ_BYTE * p_buffer,OPJ_SIZE_T p_size, opj_event_mgr_t * p_event_mgr)
{
	OPJ_SIZE_T l_remaining_bytes = 0;
	OPJ_SIZE_T l_write_nb_bytes = 0;

	if
		(p_stream->m_status & opj_stream_e_error)
	{
		return -1;
	}

	while(1)
	{
		l_remaining_bytes = p_stream->m_buffer_size - p_stream->m_bytes_in_buffer;
		// we have more memory than required
		if
			(l_remaining_bytes >= p_size)
		{
			memcpy(p_stream->m_current_data,p_buffer,p_size);
			p_stream->m_current_data += p_size;
			p_stream->m_bytes_in_buffer += p_size;
			l_write_nb_bytes += p_size;
			p_stream->m_byte_offset += p_size;
			return l_write_nb_bytes;
		}

		// we copy data and then do an actual read on the stream
		if
			(l_remaining_bytes)
		{
			l_write_nb_bytes += l_remaining_bytes;
			memcpy(p_stream->m_current_data,p_buffer,l_remaining_bytes);
			p_stream->m_current_data = p_stream->m_stored_data;
			p_buffer += l_remaining_bytes;
			p_size -= l_remaining_bytes;
			p_stream->m_bytes_in_buffer += l_remaining_bytes;
			p_stream->m_byte_offset += l_remaining_bytes;
		}
		if
			(! opj_stream_flush(p_stream, p_event_mgr))
		{
			return -1;
		}
	}

}